

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool regime_using_lpae_format(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  uint32_t el;
  TCR *pTVar2;
  _Bool _Var3;
  
  el = regime_el(env,mmu_idx);
  _Var3 = true;
  if ((el != 2) && (_Var1 = arm_el_is_aa64(env,el), !_Var1)) {
    if (((env->features & 0x4000000) != 0) &&
       (pTVar2 = regime_tcr(env,mmu_idx), (pTVar2->raw_tcr & 0x80000000) != 0)) {
      return true;
    }
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static inline bool regime_using_lpae_format(CPUARMState *env,
                                            ARMMMUIdx mmu_idx)
{
    int el = regime_el(env, mmu_idx);
    if (el == 2 || arm_el_is_aa64(env, el)) {
        return true;
    }
    if (arm_feature(env, ARM_FEATURE_LPAE)
        && (regime_tcr(env, mmu_idx)->raw_tcr & TTBCR_EAE)) {
        return true;
    }
    return false;
}